

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosString.cpp
# Opt level: O0

string * adios2::helper::AddExtension(string *name,string *extension)

{
  long lVar1;
  long lVar2;
  string *in_RDX;
  string *in_RSI;
  string *in_RDI;
  string *result;
  
  std::__cxx11::string::string((string *)in_RDI,in_RSI);
  lVar1 = std::__cxx11::string::find(in_RSI,(ulong)in_RDX);
  lVar2 = std::__cxx11::string::size();
  if (lVar1 != lVar2 + -3) {
    std::__cxx11::string::operator+=((string *)in_RDI,in_RDX);
  }
  return in_RDI;
}

Assistant:

std::string AddExtension(const std::string &name, const std::string extension) noexcept
{
    std::string result(name);
    if (name.find(extension) != name.size() - 3)
    {
        result += extension;
    }
    return result;
}